

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O1

ProString * __thiscall
ProString::append(ProString *this,ProStringList *other,bool *pending,bool skipEmpty1st)

{
  undefined8 *puVar1;
  ProString *pPVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  CutResult CVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar17 = (other->super_QList<ProString>).d.size;
  iVar15 = (int)uVar17;
  if (iVar15 != 0) {
    uVar10 = 0;
    uVar11 = 0;
    if ((((pending == (bool *)0x0) || (uVar11 = uVar10, !skipEmpty1st)) || (*pending != false)) ||
       ((((other->super_QList<ProString>).d.ptr)->m_length != 0 || (uVar11 = 1, iVar15 != 1)))) {
      if (uVar11 + 1 == iVar15 && this->m_length == 0) {
        pPVar2 = (other->super_QList<ProString>).d.ptr;
        uVar17 = (ulong)(uVar11 * 0x30);
        QString::operator=(&this->m_string,(QString *)((long)&(pPVar2->m_string).d.d + uVar17));
        puVar1 = (undefined8 *)((long)&pPVar2->m_offset + uVar17);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        this->m_offset = (int)uVar6;
        this->m_length = (int)((ulong)uVar6 >> 0x20);
        *(undefined8 *)&this->m_file = uVar7;
        this->m_hash = *(size_t *)((long)&pPVar2->m_hash + uVar17);
      }
      else {
        if (pending == (bool *)0x0) {
          bVar16 = 0;
        }
        else {
          bVar16 = (*pending ^ 1U) & this->m_length != 0;
        }
        QString::mid((longlong)&local_58,(longlong)this);
        pQVar3 = &((this->m_string).d.d)->super_QArrayData;
        pcVar4 = (this->m_string).d.ptr;
        (this->m_string).d.d = (Data *)local_58;
        (this->m_string).d.ptr = pcStack_50;
        qVar5 = (this->m_string).d.size;
        (this->m_string).d.size = local_48;
        local_58 = pQVar3;
        pcStack_50 = pcVar4;
        local_48 = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
        this->m_offset = 0;
        if ((int)uVar11 < iVar15) {
          lVar14 = (ulong)(uVar11 * 0x30) + 0x1c;
          lVar12 = (uVar17 & 0xffffffff) - (ulong)uVar11;
          do {
            bVar8 = 1;
            if (bVar16 != 0) {
              QString::append((QChar)(char16_t)this);
              bVar8 = bVar16;
            }
            bVar16 = bVar8;
            pPVar2 = (other->super_QList<ProString>).d.ptr;
            lVar13 = *(long *)((long)pPVar2 + lVar14 + -0x14);
            local_58 = (QArrayData *)(long)*(int *)((long)pPVar2 + lVar14 + -4);
            local_40 = (long)*(int *)((long)&(pPVar2->m_string).d.d + lVar14);
            CVar9 = QtPrivate::QContainerImplHelper::mid
                              (*(qsizetype *)((long)pPVar2 + lVar14 + -0xc),(qsizetype *)&local_58,
                               &local_40);
            if (CVar9 == Null) {
              lVar13 = 0;
            }
            else {
              lVar13 = lVar13 + (long)local_58 * 2;
            }
            QString::append((QChar *)this,lVar13);
            lVar14 = lVar14 + 0x30;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
        this->m_length = (int)(this->m_string).d.size;
        iVar15 = (other->super_QList<ProString>).d.ptr[(other->super_QList<ProString>).d.size + -1].
                 m_file;
        if (iVar15 != 0) {
          this->m_file = iVar15;
        }
        this->m_hash = 0x80000000;
      }
      if (pending != (bool *)0x0) {
        *pending = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &ProString::append(const ProStringList &other, bool *pending, bool skipEmpty1st)
{
    if (const int sz = other.size()) {
        int startIdx = 0;
        if (pending && !*pending && skipEmpty1st && other.at(0).isEmpty()) {
            if (sz == 1)
                return *this;
            startIdx = 1;
        }
        if (!m_length && sz == startIdx + 1) {
            *this = other.at(startIdx);
        } else {
            bool putSpace = false;
            if (pending && !*pending && m_length)
                putSpace = true;

            m_string = toQString();
            m_offset = 0;
            for (int i = startIdx; i < sz; ++i) {
                if (putSpace)
                    m_string += QLatin1Char(' ');
                else
                    putSpace = true;
                const ProString &str = other.at(i);
                m_string += str.toQStringView();
            }
            m_length = m_string.size();
            if (other.last().m_file)
                m_file = other.last().m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}